

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperVec.c
# Opt level: O0

Map_NodeVec_t * Map_NodeVecAlloc(int nCap)

{
  Map_NodeVec_t *pMVar1;
  Map_Node_t **local_20;
  Map_NodeVec_t *p;
  int nCap_local;
  
  pMVar1 = (Map_NodeVec_t *)malloc(0x10);
  p._4_4_ = nCap;
  if ((0 < nCap) && (nCap < 0x10)) {
    p._4_4_ = 0x10;
  }
  pMVar1->nSize = 0;
  pMVar1->nCap = p._4_4_;
  if (pMVar1->nCap == 0) {
    local_20 = (Map_Node_t **)0x0;
  }
  else {
    local_20 = (Map_Node_t **)malloc((long)pMVar1->nCap << 3);
  }
  pMVar1->pArray = local_20;
  return pMVar1;
}

Assistant:

Map_NodeVec_t * Map_NodeVecAlloc( int nCap )
{
    Map_NodeVec_t * p;
    p = ABC_ALLOC( Map_NodeVec_t, 1 );
    if ( nCap > 0 && nCap < 16 )
        nCap = 16;
    p->nSize  = 0;
    p->nCap   = nCap;
    p->pArray = p->nCap? ABC_ALLOC( Map_Node_t *, p->nCap ) : NULL;
    return p;
}